

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QString * __thiscall QWidget::windowRole(QWidget *this)

{
  bool bVar1;
  QString *in_RDI;
  QWidgetPrivate *d;
  QString *this_00;
  
  this_00 = in_RDI;
  d_func((QWidget *)0x372598);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3725ab);
  if (bVar1) {
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3725bf);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)0x3725cb);
    if (bVar1) {
      std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3725df);
      std::unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_>::operator->
                ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)0x3725eb);
      QString::QString(this_00,in_RDI);
      return this_00;
    }
  }
  QString::QString((QString *)0x372606);
  return this_00;
}

Assistant:

QString QWidget::windowRole() const
{
    Q_D(const QWidget);
    return (d->extra && d->extra->topextra) ? d->extra->topextra->role : QString();
}